

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family.h
# Opt level: O1

Summary * __thiscall
prometheus::Family<prometheus::Summary>::
Add<std::vector<prometheus::detail::CKMSQuantiles::Quantile,std::allocator<prometheus::detail::CKMSQuantiles::Quantile>>>
          (Family<prometheus::Summary> *this,Labels *labels,
          vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
          *args)

{
  Summary *pSVar1;
  Summary *local_20;
  
  detail::
  make_unique<prometheus::Summary,std::vector<prometheus::detail::CKMSQuantiles::Quantile,std::allocator<prometheus::detail::CKMSQuantiles::Quantile>>&>
            ((detail *)&local_20,args);
  pSVar1 = Add(this,labels,
               (unique_ptr<prometheus::Summary,_std::default_delete<prometheus::Summary>_> *)
               &local_20);
  if (local_20 != (Summary *)0x0) {
    std::default_delete<prometheus::Summary>::operator()
              ((default_delete<prometheus::Summary> *)&local_20,local_20);
  }
  return pSVar1;
}

Assistant:

T& Add(const Labels& labels, Args&&... args) {
    return Add(labels, detail::make_unique<T>(args...));
  }